

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O2

void __thiscall deqp::egl::RenderTestThread::run(RenderTestThread *this)

{
  deUint32 dVar1;
  vector<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_> *pvVar2;
  long lVar3;
  pointer pDVar4;
  int ndx;
  long lVar5;
  
  pvVar2 = this->m_packets;
  for (pDVar4 = (pvVar2->
                super__Vector_base<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pDVar4 != (pvVar2->
                super__Vector_base<deqp::egl::DrawOpPacket,_std::allocator<deqp::egl::DrawOpPacket>_>
                )._M_impl.super__Vector_impl_data._M_finish; pDVar4 = pDVar4 + 1) {
    de::Semaphore::decrement((pDVar4->wait).m_ptr);
    (*this->m_egl->_vptr_Library[0x27])
              (this->m_egl,this->m_display,this->m_surface,this->m_surface,this->m_context);
    dVar1 = (*this->m_egl->_vptr_Library[0x1f])();
    eglu::checkError(dVar1,"makeCurrent(m_display, m_surface, m_surface, m_context)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                     ,0x359);
    lVar3 = 0;
    lVar5 = 0;
    while( true ) {
      if (pDVar4->numOps <= lVar5) break;
      anon_unknown_4::draw
                (this->m_gl,this->m_api,this->m_program,
                 (DrawPrimitiveOp *)((long)&pDVar4->drawOps->type + lVar3));
      lVar5 = lVar5 + 1;
      lVar3 = lVar3 + 0x48;
    }
    anon_unknown_4::finish(this->m_gl,this->m_api);
    (*this->m_egl->_vptr_Library[0x27])(this->m_egl,this->m_display,0,0,0);
    dVar1 = (*this->m_egl->_vptr_Library[0x1f])();
    eglu::checkError(dVar1,"makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                     ,0x362);
    de::Semaphore::increment((pDVar4->signal).m_ptr);
    pvVar2 = this->m_packets;
  }
  return;
}

Assistant:

void run (void)
	{
		for (std::vector<DrawOpPacket>::const_iterator packetIter = m_packets.begin(); packetIter != m_packets.end(); packetIter++)
		{
			// Wait until it is our turn.
			packetIter->wait->decrement();

			// Acquire context.
			EGLU_CHECK_CALL(m_egl, makeCurrent(m_display, m_surface, m_surface, m_context));

			// Execute rendering.
			for (int ndx = 0; ndx < packetIter->numOps; ndx++)
				draw(m_gl, m_api, m_program, packetIter->drawOps[ndx]);

			finish(m_gl, m_api);

			// Release context.
			EGLU_CHECK_CALL(m_egl, makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));

			// Signal completion.
			packetIter->signal->increment();
		}
	}